

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QMimeMagicRule>::emplace<QMimeMagicRule>
          (QMovableArrayOps<QMimeMagicRule> *this,qsizetype i,QMimeMagicRule *args)

{
  QMimeMagicRule **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_e0;
  QMimeMagicRule tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.size
        == i) {
      qVar5 = QArrayDataPointer<QMimeMagicRule>::freeSpaceAtEnd
                        ((QArrayDataPointer<QMimeMagicRule> *)this);
      if (qVar5 == 0) goto LAB_004528be;
      QMimeMagicRule::QMimeMagicRule
                ((this->super_QGenericArrayOps<QMimeMagicRule>).
                 super_QArrayDataPointer<QMimeMagicRule>.ptr +
                 (this->super_QGenericArrayOps<QMimeMagicRule>).
                 super_QArrayDataPointer<QMimeMagicRule>.size,args);
LAB_004529c5:
      pqVar2 = &(this->super_QGenericArrayOps<QMimeMagicRule>).
                super_QArrayDataPointer<QMimeMagicRule>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00452977;
    }
LAB_004528be:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QMimeMagicRule>::freeSpaceAtBegin
                        ((QArrayDataPointer<QMimeMagicRule> *)this);
      if (qVar5 != 0) {
        QMimeMagicRule::QMimeMagicRule
                  ((this->super_QGenericArrayOps<QMimeMagicRule>).
                   super_QArrayDataPointer<QMimeMagicRule>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QMimeMagicRule>).
                   super_QArrayDataPointer<QMimeMagicRule>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_004529c5;
      }
    }
  }
  memset(&tmp,0xaa,0x88);
  QMimeMagicRule::QMimeMagicRule(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.
          size != 0;
  QArrayDataPointer<QMimeMagicRule>::detachAndGrow
            ((QArrayDataPointer<QMimeMagicRule> *)this,(uint)(i == 0 && bVar6),1,
             (QMimeMagicRule **)0x0,(QArrayDataPointer<QMimeMagicRule> *)0x0);
  if (i == 0 && bVar6) {
    QMimeMagicRule::QMimeMagicRule
              ((this->super_QGenericArrayOps<QMimeMagicRule>).
               super_QArrayDataPointer<QMimeMagicRule>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QMimeMagicRule>).
               super_QArrayDataPointer<QMimeMagicRule>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_e0,(QArrayDataPointer<QMimeMagicRule> *)this,i,1);
    QMimeMagicRule::QMimeMagicRule(local_e0.displaceFrom,&tmp);
    local_e0.displaceFrom = local_e0.displaceFrom + 1;
    (local_e0.data)->size = (local_e0.data)->size + local_e0.nInserts;
  }
  QMimeMagicRule::~QMimeMagicRule(&tmp);
LAB_00452977:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }